

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O0

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::
dispatch<true,TI::TMS::RefreshSequencer<(TI::TMS::Personality)3>>
          (Base<(TI::TMS::Personality)3> *this,RefreshSequencer<(TI::TMS::Personality)3> *fetcher,
          int start,int end)

{
  int end_local;
  int start_local;
  RefreshSequencer<(TI::TMS::Personality)3> *fetcher_local;
  Base<(TI::TMS::Personality)3> *this_local;
  
  switch(start) {
  case 0:
    break;
  case 1:
    goto switchD_00254647_caseD_1;
  case 2:
    goto switchD_00254647_caseD_2;
  case 3:
    goto switchD_00254647_caseD_3;
  case 4:
    goto switchD_00254647_caseD_4;
  case 5:
    goto switchD_00254647_caseD_5;
  case 6:
    goto switchD_00254647_caseD_6;
  case 7:
    goto switchD_00254647_caseD_7;
  case 8:
    goto switchD_00254647_caseD_8;
  case 9:
    goto switchD_00254647_caseD_9;
  case 10:
    goto switchD_00254647_caseD_a;
  case 0xb:
    goto switchD_00254647_caseD_b;
  case 0xc:
    goto switchD_00254647_caseD_c;
  case 0xd:
    goto switchD_00254647_caseD_d;
  case 0xe:
    goto switchD_00254647_caseD_e;
  case 0xf:
    goto switchD_00254647_caseD_f;
  case 0x10:
    goto switchD_00254647_caseD_10;
  case 0x11:
    goto switchD_00254647_caseD_11;
  case 0x12:
    goto switchD_00254647_caseD_12;
  case 0x13:
    goto switchD_00254647_caseD_13;
  case 0x14:
    goto switchD_00254647_caseD_14;
  case 0x15:
    goto switchD_00254647_caseD_15;
  case 0x16:
    goto switchD_00254647_caseD_16;
  case 0x17:
    goto switchD_00254647_caseD_17;
  case 0x18:
    goto switchD_00254647_caseD_18;
  case 0x19:
    goto switchD_00254647_caseD_19;
  case 0x1a:
    goto switchD_00254647_caseD_1a;
  case 0x1b:
    goto switchD_00254647_caseD_1b;
  case 0x1c:
    goto switchD_00254647_caseD_1c;
  case 0x1d:
    goto switchD_00254647_caseD_1d;
  case 0x1e:
    goto switchD_00254647_caseD_1e;
  case 0x1f:
    goto switchD_00254647_caseD_1f;
  case 0x20:
    goto switchD_00254647_caseD_20;
  case 0x21:
    goto switchD_00254647_caseD_21;
  case 0x22:
    goto switchD_00254647_caseD_22;
  case 0x23:
    goto switchD_00254647_caseD_23;
  case 0x24:
    goto switchD_00254647_caseD_24;
  case 0x25:
    goto switchD_00254647_caseD_25;
  case 0x26:
    goto switchD_00254647_caseD_26;
  case 0x27:
    goto switchD_00254647_caseD_27;
  case 0x28:
    goto switchD_00254647_caseD_28;
  case 0x29:
    goto switchD_00254647_caseD_29;
  case 0x2a:
    goto switchD_00254647_caseD_2a;
  case 0x2b:
    goto switchD_00254647_caseD_2b;
  case 0x2c:
    goto switchD_00254647_caseD_2c;
  case 0x2d:
    goto switchD_00254647_caseD_2d;
  case 0x2e:
    goto switchD_00254647_caseD_2e;
  case 0x2f:
    goto switchD_00254647_caseD_2f;
  case 0x30:
    goto switchD_00254647_caseD_30;
  case 0x31:
    goto switchD_00254647_caseD_31;
  case 0x32:
    goto switchD_00254647_caseD_32;
  case 0x33:
    goto switchD_00254647_caseD_33;
  case 0x34:
    goto switchD_00254647_caseD_34;
  case 0x35:
    goto switchD_00254647_caseD_35;
  case 0x36:
    goto switchD_00254647_caseD_36;
  case 0x37:
    goto switchD_00254647_caseD_37;
  case 0x38:
    goto switchD_00254647_caseD_38;
  case 0x39:
    goto switchD_00254647_caseD_39;
  case 0x3a:
    goto switchD_00254647_caseD_3a;
  case 0x3b:
    goto switchD_00254647_caseD_3b;
  case 0x3c:
    goto switchD_00254647_caseD_3c;
  case 0x3d:
    goto switchD_00254647_caseD_3d;
  case 0x3e:
    goto switchD_00254647_caseD_3e;
  case 0x3f:
    goto switchD_00254647_caseD_3f;
  case 0x40:
    goto switchD_00254647_caseD_40;
  case 0x41:
    goto switchD_00254647_caseD_41;
  case 0x42:
    goto switchD_00254647_caseD_42;
  case 0x43:
    goto switchD_00254647_caseD_43;
  case 0x44:
    goto switchD_00254647_caseD_44;
  case 0x45:
    goto switchD_00254647_caseD_45;
  case 0x46:
    goto switchD_00254647_caseD_46;
  case 0x47:
    goto switchD_00254647_caseD_47;
  case 0x48:
    goto switchD_00254647_caseD_48;
  case 0x49:
    goto switchD_00254647_caseD_49;
  case 0x4a:
    goto switchD_00254647_caseD_4a;
  case 0x4b:
    goto switchD_00254647_caseD_4b;
  case 0x4c:
    goto switchD_00254647_caseD_4c;
  case 0x4d:
    goto switchD_00254647_caseD_4d;
  case 0x4e:
    goto switchD_00254647_caseD_4e;
  case 0x4f:
    goto switchD_00254647_caseD_4f;
  case 0x50:
    goto switchD_00254647_caseD_50;
  case 0x51:
    goto switchD_00254647_caseD_51;
  case 0x52:
    goto switchD_00254647_caseD_52;
  case 0x53:
    goto switchD_00254647_caseD_53;
  case 0x54:
    goto switchD_00254647_caseD_54;
  case 0x55:
    goto switchD_00254647_caseD_55;
  case 0x56:
    goto switchD_00254647_caseD_56;
  case 0x57:
    goto switchD_00254647_caseD_57;
  case 0x58:
    goto switchD_00254647_caseD_58;
  case 0x59:
    goto switchD_00254647_caseD_59;
  case 0x5a:
    goto switchD_00254647_caseD_5a;
  case 0x5b:
    goto switchD_00254647_caseD_5b;
  case 0x5c:
    goto switchD_00254647_caseD_5c;
  case 0x5d:
    goto switchD_00254647_caseD_5d;
  case 0x5e:
    goto switchD_00254647_caseD_5e;
  case 0x5f:
    goto switchD_00254647_caseD_5f;
  case 0x60:
    goto switchD_00254647_caseD_60;
  case 0x61:
    goto switchD_00254647_caseD_61;
  case 0x62:
    goto switchD_00254647_caseD_62;
  case 99:
    goto switchD_00254647_caseD_63;
  case 100:
    goto switchD_00254647_caseD_64;
  case 0x65:
    goto switchD_00254647_caseD_65;
  case 0x66:
    goto switchD_00254647_caseD_66;
  case 0x67:
    goto switchD_00254647_caseD_67;
  case 0x68:
    goto switchD_00254647_caseD_68;
  case 0x69:
    goto switchD_00254647_caseD_69;
  case 0x6a:
    goto switchD_00254647_caseD_6a;
  case 0x6b:
    goto switchD_00254647_caseD_6b;
  case 0x6c:
    goto switchD_00254647_caseD_6c;
  case 0x6d:
    goto switchD_00254647_caseD_6d;
  case 0x6e:
    goto switchD_00254647_caseD_6e;
  case 0x6f:
    goto switchD_00254647_caseD_6f;
  case 0x70:
    goto switchD_00254647_caseD_70;
  case 0x71:
    goto switchD_00254647_caseD_71;
  case 0x72:
    goto switchD_00254647_caseD_72;
  case 0x73:
    goto switchD_00254647_caseD_73;
  case 0x74:
    goto switchD_00254647_caseD_74;
  case 0x75:
    goto switchD_00254647_caseD_75;
  case 0x76:
    goto switchD_00254647_caseD_76;
  case 0x77:
    goto switchD_00254647_caseD_77;
  case 0x78:
    goto switchD_00254647_caseD_78;
  case 0x79:
    goto switchD_00254647_caseD_79;
  case 0x7a:
    goto switchD_00254647_caseD_7a;
  case 0x7b:
    goto switchD_00254647_caseD_7b;
  case 0x7c:
    goto switchD_00254647_caseD_7c;
  case 0x7d:
    goto switchD_00254647_caseD_7d;
  case 0x7e:
    goto switchD_00254647_caseD_7e;
  case 0x7f:
    goto switchD_00254647_caseD_7f;
  case 0x80:
    goto switchD_00254647_caseD_80;
  case 0x81:
    goto switchD_00254647_caseD_81;
  case 0x82:
    goto switchD_00254647_caseD_82;
  case 0x83:
    goto switchD_00254647_caseD_83;
  case 0x84:
    goto switchD_00254647_caseD_84;
  case 0x85:
    goto switchD_00254647_caseD_85;
  case 0x86:
    goto switchD_00254647_caseD_86;
  case 0x87:
    goto switchD_00254647_caseD_87;
  case 0x88:
    goto switchD_00254647_caseD_88;
  case 0x89:
    goto switchD_00254647_caseD_89;
  case 0x8a:
    goto switchD_00254647_caseD_8a;
  case 0x8b:
    goto switchD_00254647_caseD_8b;
  case 0x8c:
    goto switchD_00254647_caseD_8c;
  case 0x8d:
    goto switchD_00254647_caseD_8d;
  case 0x8e:
    goto switchD_00254647_caseD_8e;
  case 0x8f:
    goto switchD_00254647_caseD_8f;
  case 0x90:
    goto switchD_00254647_caseD_90;
  case 0x91:
    goto switchD_00254647_caseD_91;
  case 0x92:
    goto switchD_00254647_caseD_92;
  case 0x93:
    goto switchD_00254647_caseD_93;
  case 0x94:
    goto switchD_00254647_caseD_94;
  case 0x95:
    goto switchD_00254647_caseD_95;
  case 0x96:
    goto switchD_00254647_caseD_96;
  case 0x97:
    goto switchD_00254647_caseD_97;
  case 0x98:
    goto switchD_00254647_caseD_98;
  case 0x99:
    goto switchD_00254647_caseD_99;
  case 0x9a:
    goto switchD_00254647_caseD_9a;
  case 0x9b:
    goto switchD_00254647_caseD_9b;
  case 0x9c:
    goto switchD_00254647_caseD_9c;
  case 0x9d:
    goto switchD_00254647_caseD_9d;
  case 0x9e:
    goto switchD_00254647_caseD_9e;
  case 0x9f:
    goto switchD_00254647_caseD_9f;
  case 0xa0:
    goto switchD_00254647_caseD_a0;
  case 0xa1:
    goto switchD_00254647_caseD_a1;
  case 0xa2:
    goto switchD_00254647_caseD_a2;
  case 0xa3:
    goto switchD_00254647_caseD_a3;
  case 0xa4:
    goto switchD_00254647_caseD_a4;
  case 0xa5:
    goto switchD_00254647_caseD_a5;
  case 0xa6:
    goto switchD_00254647_caseD_a6;
  case 0xa7:
    goto switchD_00254647_caseD_a7;
  case 0xa8:
    goto switchD_00254647_caseD_a8;
  case 0xa9:
    goto switchD_00254647_caseD_a9;
  case 0xaa:
    goto switchD_00254647_caseD_aa;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Components/9918/Implementation/../Implementation/Fetch.hpp"
                  ,0x3b,
                  "void TI::TMS::Base<TI::TMS::SMSVDP>::dispatch(SequencerT &, int, int) [personality = TI::TMS::SMSVDP, use_end = true, Fetcher = TI::TMS::RefreshSequencer<TI::TMS::SMSVDP>]"
                 );
  }
  RefreshSequencer<(TI::TMS::Personality)3>::fetch<0>(fetcher);
  if (end == 1) {
    return;
  }
switchD_00254647_caseD_1:
  RefreshSequencer<(TI::TMS::Personality)3>::fetch<1>(fetcher);
  if (end != 2) {
switchD_00254647_caseD_2:
    RefreshSequencer<(TI::TMS::Personality)3>::fetch<2>(fetcher);
    if (end != 3) {
switchD_00254647_caseD_3:
      RefreshSequencer<(TI::TMS::Personality)3>::fetch<3>(fetcher);
      if (end != 4) {
switchD_00254647_caseD_4:
        RefreshSequencer<(TI::TMS::Personality)3>::fetch<4>(fetcher);
        if (end != 5) {
switchD_00254647_caseD_5:
          RefreshSequencer<(TI::TMS::Personality)3>::fetch<5>(fetcher);
          if (end != 6) {
switchD_00254647_caseD_6:
            RefreshSequencer<(TI::TMS::Personality)3>::fetch<6>(fetcher);
            if (end != 7) {
switchD_00254647_caseD_7:
              RefreshSequencer<(TI::TMS::Personality)3>::fetch<7>(fetcher);
              if (end != 8) {
switchD_00254647_caseD_8:
                RefreshSequencer<(TI::TMS::Personality)3>::fetch<8>(fetcher);
                if (end != 9) {
switchD_00254647_caseD_9:
                  RefreshSequencer<(TI::TMS::Personality)3>::fetch<9>(fetcher);
                  if (end != 10) {
switchD_00254647_caseD_a:
                    RefreshSequencer<(TI::TMS::Personality)3>::fetch<10>(fetcher);
                    if (end != 0xb) {
switchD_00254647_caseD_b:
                      RefreshSequencer<(TI::TMS::Personality)3>::fetch<11>(fetcher);
                      if (end != 0xc) {
switchD_00254647_caseD_c:
                        RefreshSequencer<(TI::TMS::Personality)3>::fetch<12>(fetcher);
                        if (end != 0xd) {
switchD_00254647_caseD_d:
                          RefreshSequencer<(TI::TMS::Personality)3>::fetch<13>(fetcher);
                          if (end != 0xe) {
switchD_00254647_caseD_e:
                            RefreshSequencer<(TI::TMS::Personality)3>::fetch<14>(fetcher);
                            if (end != 0xf) {
switchD_00254647_caseD_f:
                              RefreshSequencer<(TI::TMS::Personality)3>::fetch<15>(fetcher);
                              if (end != 0x10) {
switchD_00254647_caseD_10:
                                RefreshSequencer<(TI::TMS::Personality)3>::fetch<16>(fetcher);
                                if (end != 0x11) {
switchD_00254647_caseD_11:
                                  RefreshSequencer<(TI::TMS::Personality)3>::fetch<17>(fetcher);
                                  if (end != 0x12) {
switchD_00254647_caseD_12:
                                    RefreshSequencer<(TI::TMS::Personality)3>::fetch<18>(fetcher);
                                    if (end != 0x13) {
switchD_00254647_caseD_13:
                                      RefreshSequencer<(TI::TMS::Personality)3>::fetch<19>(fetcher);
                                      if (end != 0x14) {
switchD_00254647_caseD_14:
                                        RefreshSequencer<(TI::TMS::Personality)3>::fetch<20>
                                                  (fetcher);
                                        if (end != 0x15) {
switchD_00254647_caseD_15:
                                          RefreshSequencer<(TI::TMS::Personality)3>::fetch<21>
                                                    (fetcher);
                                          if (end != 0x16) {
switchD_00254647_caseD_16:
                                            RefreshSequencer<(TI::TMS::Personality)3>::fetch<22>
                                                      (fetcher);
                                            if (end != 0x17) {
switchD_00254647_caseD_17:
                                              RefreshSequencer<(TI::TMS::Personality)3>::fetch<23>
                                                        (fetcher);
                                              if (end != 0x18) {
switchD_00254647_caseD_18:
                                                RefreshSequencer<(TI::TMS::Personality)3>::fetch<24>
                                                          (fetcher);
                                                if (end != 0x19) {
switchD_00254647_caseD_19:
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<25>(fetcher);
                                                  if (end != 0x1a) {
switchD_00254647_caseD_1a:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<26>(fetcher);
                                                    if (end != 0x1b) {
switchD_00254647_caseD_1b:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<27>(fetcher);
                                                      if (end != 0x1c) {
switchD_00254647_caseD_1c:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<28>(fetcher);
                                                        if (end != 0x1d) {
switchD_00254647_caseD_1d:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<29>(fetcher);
                                                          if (end != 0x1e) {
switchD_00254647_caseD_1e:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<30>(fetcher);
                                                  if (end != 0x1f) {
switchD_00254647_caseD_1f:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<31>(fetcher);
                                                    if (end != 0x20) {
switchD_00254647_caseD_20:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<32>(fetcher);
                                                      if (end != 0x21) {
switchD_00254647_caseD_21:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<33>(fetcher);
                                                        if (end != 0x22) {
switchD_00254647_caseD_22:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<34>(fetcher);
                                                          if (end != 0x23) {
switchD_00254647_caseD_23:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<35>(fetcher);
                                                  if (end != 0x24) {
switchD_00254647_caseD_24:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<36>(fetcher);
                                                    if (end != 0x25) {
switchD_00254647_caseD_25:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<37>(fetcher);
                                                      if (end != 0x26) {
switchD_00254647_caseD_26:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<38>(fetcher);
                                                        if (end != 0x27) {
switchD_00254647_caseD_27:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<39>(fetcher);
                                                          if (end != 0x28) {
switchD_00254647_caseD_28:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<40>(fetcher);
                                                  if (end != 0x29) {
switchD_00254647_caseD_29:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<41>(fetcher);
                                                    if (end != 0x2a) {
switchD_00254647_caseD_2a:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<42>(fetcher);
                                                      if (end != 0x2b) {
switchD_00254647_caseD_2b:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<43>(fetcher);
                                                        if (end != 0x2c) {
switchD_00254647_caseD_2c:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<44>(fetcher);
                                                          if (end != 0x2d) {
switchD_00254647_caseD_2d:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<45>(fetcher);
                                                  if (end != 0x2e) {
switchD_00254647_caseD_2e:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<46>(fetcher);
                                                    if (end != 0x2f) {
switchD_00254647_caseD_2f:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<47>(fetcher);
                                                      if (end != 0x30) {
switchD_00254647_caseD_30:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<48>(fetcher);
                                                        if (end != 0x31) {
switchD_00254647_caseD_31:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<49>(fetcher);
                                                          if (end != 0x32) {
switchD_00254647_caseD_32:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<50>(fetcher);
                                                  if (end != 0x33) {
switchD_00254647_caseD_33:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<51>(fetcher);
                                                    if (end != 0x34) {
switchD_00254647_caseD_34:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<52>(fetcher);
                                                      if (end != 0x35) {
switchD_00254647_caseD_35:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<53>(fetcher);
                                                        if (end != 0x36) {
switchD_00254647_caseD_36:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<54>(fetcher);
                                                          if (end != 0x37) {
switchD_00254647_caseD_37:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<55>(fetcher);
                                                  if (end != 0x38) {
switchD_00254647_caseD_38:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<56>(fetcher);
                                                    if (end != 0x39) {
switchD_00254647_caseD_39:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<57>(fetcher);
                                                      if (end != 0x3a) {
switchD_00254647_caseD_3a:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<58>(fetcher);
                                                        if (end != 0x3b) {
switchD_00254647_caseD_3b:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<59>(fetcher);
                                                          if (end != 0x3c) {
switchD_00254647_caseD_3c:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<60>(fetcher);
                                                  if (end != 0x3d) {
switchD_00254647_caseD_3d:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<61>(fetcher);
                                                    if (end != 0x3e) {
switchD_00254647_caseD_3e:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<62>(fetcher);
                                                      if (end != 0x3f) {
switchD_00254647_caseD_3f:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<63>(fetcher);
                                                        if (end != 0x40) {
switchD_00254647_caseD_40:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<64>(fetcher);
                                                          if (end != 0x41) {
switchD_00254647_caseD_41:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<65>(fetcher);
                                                  if (end != 0x42) {
switchD_00254647_caseD_42:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<66>(fetcher);
                                                    if (end != 0x43) {
switchD_00254647_caseD_43:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<67>(fetcher);
                                                      if (end != 0x44) {
switchD_00254647_caseD_44:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<68>(fetcher);
                                                        if (end != 0x45) {
switchD_00254647_caseD_45:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<69>(fetcher);
                                                          if (end != 0x46) {
switchD_00254647_caseD_46:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<70>(fetcher);
                                                  if (end != 0x47) {
switchD_00254647_caseD_47:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<71>(fetcher);
                                                    if (end != 0x48) {
switchD_00254647_caseD_48:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<72>(fetcher);
                                                      if (end != 0x49) {
switchD_00254647_caseD_49:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<73>(fetcher);
                                                        if (end != 0x4a) {
switchD_00254647_caseD_4a:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<74>(fetcher);
                                                          if (end != 0x4b) {
switchD_00254647_caseD_4b:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<75>(fetcher);
                                                  if (end != 0x4c) {
switchD_00254647_caseD_4c:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<76>(fetcher);
                                                    if (end != 0x4d) {
switchD_00254647_caseD_4d:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<77>(fetcher);
                                                      if (end != 0x4e) {
switchD_00254647_caseD_4e:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<78>(fetcher);
                                                        if (end != 0x4f) {
switchD_00254647_caseD_4f:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<79>(fetcher);
                                                          if (end != 0x50) {
switchD_00254647_caseD_50:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<80>(fetcher);
                                                  if (end != 0x51) {
switchD_00254647_caseD_51:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<81>(fetcher);
                                                    if (end != 0x52) {
switchD_00254647_caseD_52:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<82>(fetcher);
                                                      if (end != 0x53) {
switchD_00254647_caseD_53:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<83>(fetcher);
                                                        if (end != 0x54) {
switchD_00254647_caseD_54:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<84>(fetcher);
                                                          if (end != 0x55) {
switchD_00254647_caseD_55:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<85>(fetcher);
                                                  if (end != 0x56) {
switchD_00254647_caseD_56:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<86>(fetcher);
                                                    if (end != 0x57) {
switchD_00254647_caseD_57:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<87>(fetcher);
                                                      if (end != 0x58) {
switchD_00254647_caseD_58:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<88>(fetcher);
                                                        if (end != 0x59) {
switchD_00254647_caseD_59:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<89>(fetcher);
                                                          if (end != 0x5a) {
switchD_00254647_caseD_5a:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<90>(fetcher);
                                                  if (end != 0x5b) {
switchD_00254647_caseD_5b:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<91>(fetcher);
                                                    if (end != 0x5c) {
switchD_00254647_caseD_5c:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<92>(fetcher);
                                                      if (end != 0x5d) {
switchD_00254647_caseD_5d:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<93>(fetcher);
                                                        if (end != 0x5e) {
switchD_00254647_caseD_5e:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<94>(fetcher);
                                                          if (end != 0x5f) {
switchD_00254647_caseD_5f:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<95>(fetcher);
                                                  if (end != 0x60) {
switchD_00254647_caseD_60:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<96>(fetcher);
                                                    if (end != 0x61) {
switchD_00254647_caseD_61:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<97>(fetcher);
                                                      if (end != 0x62) {
switchD_00254647_caseD_62:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<98>(fetcher);
                                                        if (end != 99) {
switchD_00254647_caseD_63:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<99>(fetcher);
                                                          if (end != 100) {
switchD_00254647_caseD_64:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<100>(fetcher);
                                                  if (end != 0x65) {
switchD_00254647_caseD_65:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<101>(fetcher);
                                                    if (end != 0x66) {
switchD_00254647_caseD_66:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<102>(fetcher);
                                                      if (end != 0x67) {
switchD_00254647_caseD_67:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<103>(fetcher);
                                                        if (end != 0x68) {
switchD_00254647_caseD_68:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<104>(fetcher);
                                                          if (end != 0x69) {
switchD_00254647_caseD_69:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<105>(fetcher);
                                                  if (end != 0x6a) {
switchD_00254647_caseD_6a:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<106>(fetcher);
                                                    if (end != 0x6b) {
switchD_00254647_caseD_6b:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<107>(fetcher);
                                                      if (end != 0x6c) {
switchD_00254647_caseD_6c:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<108>(fetcher);
                                                        if (end != 0x6d) {
switchD_00254647_caseD_6d:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<109>(fetcher);
                                                          if (end != 0x6e) {
switchD_00254647_caseD_6e:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<110>(fetcher);
                                                  if (end != 0x6f) {
switchD_00254647_caseD_6f:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<111>(fetcher);
                                                    if (end != 0x70) {
switchD_00254647_caseD_70:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<112>(fetcher);
                                                      if (end != 0x71) {
switchD_00254647_caseD_71:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<113>(fetcher);
                                                        if (end != 0x72) {
switchD_00254647_caseD_72:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<114>(fetcher);
                                                          if (end != 0x73) {
switchD_00254647_caseD_73:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<115>(fetcher);
                                                  if (end != 0x74) {
switchD_00254647_caseD_74:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<116>(fetcher);
                                                    if (end != 0x75) {
switchD_00254647_caseD_75:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<117>(fetcher);
                                                      if (end != 0x76) {
switchD_00254647_caseD_76:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<118>(fetcher);
                                                        if (end != 0x77) {
switchD_00254647_caseD_77:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<119>(fetcher);
                                                          if (end != 0x78) {
switchD_00254647_caseD_78:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<120>(fetcher);
                                                  if (end != 0x79) {
switchD_00254647_caseD_79:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<121>(fetcher);
                                                    if (end != 0x7a) {
switchD_00254647_caseD_7a:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<122>(fetcher);
                                                      if (end != 0x7b) {
switchD_00254647_caseD_7b:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<123>(fetcher);
                                                        if (end != 0x7c) {
switchD_00254647_caseD_7c:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<124>(fetcher);
                                                          if (end != 0x7d) {
switchD_00254647_caseD_7d:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<125>(fetcher);
                                                  if (end != 0x7e) {
switchD_00254647_caseD_7e:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<126>(fetcher);
                                                    if (end != 0x7f) {
switchD_00254647_caseD_7f:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<127>(fetcher);
                                                      if (end != 0x80) {
switchD_00254647_caseD_80:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<128>(fetcher);
                                                        if (end != 0x81) {
switchD_00254647_caseD_81:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<129>(fetcher);
                                                          if (end != 0x82) {
switchD_00254647_caseD_82:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<130>(fetcher);
                                                  if (end != 0x83) {
switchD_00254647_caseD_83:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<131>(fetcher);
                                                    if (end != 0x84) {
switchD_00254647_caseD_84:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<132>(fetcher);
                                                      if (end != 0x85) {
switchD_00254647_caseD_85:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<133>(fetcher);
                                                        if (end != 0x86) {
switchD_00254647_caseD_86:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<134>(fetcher);
                                                          if (end != 0x87) {
switchD_00254647_caseD_87:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<135>(fetcher);
                                                  if (end != 0x88) {
switchD_00254647_caseD_88:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<136>(fetcher);
                                                    if (end != 0x89) {
switchD_00254647_caseD_89:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<137>(fetcher);
                                                      if (end != 0x8a) {
switchD_00254647_caseD_8a:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<138>(fetcher);
                                                        if (end != 0x8b) {
switchD_00254647_caseD_8b:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<139>(fetcher);
                                                          if (end != 0x8c) {
switchD_00254647_caseD_8c:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<140>(fetcher);
                                                  if (end != 0x8d) {
switchD_00254647_caseD_8d:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<141>(fetcher);
                                                    if (end != 0x8e) {
switchD_00254647_caseD_8e:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<142>(fetcher);
                                                      if (end != 0x8f) {
switchD_00254647_caseD_8f:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<143>(fetcher);
                                                        if (end != 0x90) {
switchD_00254647_caseD_90:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<144>(fetcher);
                                                          if (end != 0x91) {
switchD_00254647_caseD_91:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<145>(fetcher);
                                                  if (end != 0x92) {
switchD_00254647_caseD_92:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<146>(fetcher);
                                                    if (end != 0x93) {
switchD_00254647_caseD_93:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<147>(fetcher);
                                                      if (end != 0x94) {
switchD_00254647_caseD_94:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<148>(fetcher);
                                                        if (end != 0x95) {
switchD_00254647_caseD_95:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<149>(fetcher);
                                                          if (end != 0x96) {
switchD_00254647_caseD_96:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<150>(fetcher);
                                                  if (end != 0x97) {
switchD_00254647_caseD_97:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<151>(fetcher);
                                                    if (end != 0x98) {
switchD_00254647_caseD_98:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<152>(fetcher);
                                                      if (end != 0x99) {
switchD_00254647_caseD_99:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<153>(fetcher);
                                                        if (end != 0x9a) {
switchD_00254647_caseD_9a:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<154>(fetcher);
                                                          if (end != 0x9b) {
switchD_00254647_caseD_9b:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<155>(fetcher);
                                                  if (end != 0x9c) {
switchD_00254647_caseD_9c:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<156>(fetcher);
                                                    if (end != 0x9d) {
switchD_00254647_caseD_9d:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<157>(fetcher);
                                                      if (end != 0x9e) {
switchD_00254647_caseD_9e:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<158>(fetcher);
                                                        if (end != 0x9f) {
switchD_00254647_caseD_9f:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<159>(fetcher);
                                                          if (end != 0xa0) {
switchD_00254647_caseD_a0:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<160>(fetcher);
                                                  if (end != 0xa1) {
switchD_00254647_caseD_a1:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<161>(fetcher);
                                                    if (end != 0xa2) {
switchD_00254647_caseD_a2:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<162>(fetcher);
                                                      if (end != 0xa3) {
switchD_00254647_caseD_a3:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<163>(fetcher);
                                                        if (end != 0xa4) {
switchD_00254647_caseD_a4:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<164>(fetcher);
                                                          if (end != 0xa5) {
switchD_00254647_caseD_a5:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<165>(fetcher);
                                                  if (end != 0xa6) {
switchD_00254647_caseD_a6:
                                                    RefreshSequencer<(TI::TMS::Personality)3>::
                                                    fetch<166>(fetcher);
                                                    if (end != 0xa7) {
switchD_00254647_caseD_a7:
                                                      RefreshSequencer<(TI::TMS::Personality)3>::
                                                      fetch<167>(fetcher);
                                                      if (end != 0xa8) {
switchD_00254647_caseD_a8:
                                                        RefreshSequencer<(TI::TMS::Personality)3>::
                                                        fetch<168>(fetcher);
                                                        if (end != 0xa9) {
switchD_00254647_caseD_a9:
                                                          RefreshSequencer<(TI::TMS::Personality)3>
                                                          ::fetch<169>(fetcher);
                                                          if (end != 0xaa) {
switchD_00254647_caseD_aa:
                                                                                                                        
                                                  RefreshSequencer<(TI::TMS::Personality)3>::
                                                  fetch<170>(fetcher);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Base<personality>::dispatch(SequencerT &fetcher, int start, int end) {
#define index(n)						\
	if(use_end && end == n) return;		\
	[[fallthrough]];					\
	case n: fetcher.template fetch<from_internal<personality, Clock::FromStartOfSync>(n)>();

	switch(start) {
		default: assert(false);
		index(0);	index(1);	index(2);	index(3);	index(4);	index(5);	index(6);	index(7);	index(8);	index(9);
		index(10);	index(11);	index(12);	index(13);	index(14);	index(15);	index(16);	index(17);	index(18);	index(19);
		index(20);	index(21);	index(22);	index(23);	index(24);	index(25);	index(26);	index(27);	index(28);	index(29);
		index(30);	index(31);	index(32);	index(33);	index(34);	index(35);	index(36);	index(37);	index(38);	index(39);
		index(40);	index(41);	index(42);	index(43);	index(44);	index(45);	index(46);	index(47);	index(48);	index(49);
		index(50);	index(51);	index(52);	index(53);	index(54);	index(55);	index(56);	index(57);	index(58);	index(59);
		index(60);	index(61);	index(62);	index(63);	index(64);	index(65);	index(66);	index(67);	index(68);	index(69);
		index(70);	index(71);	index(72);	index(73);	index(74);	index(75);	index(76);	index(77);	index(78);	index(79);
		index(80);	index(81);	index(82);	index(83);	index(84);	index(85);	index(86);	index(87);	index(88);	index(89);
		index(90);	index(91);	index(92);	index(93);	index(94);	index(95);	index(96);	index(97);	index(98);	index(99);
		index(100);	index(101);	index(102);	index(103);	index(104);	index(105);	index(106);	index(107);	index(108);	index(109);
		index(110);	index(111);	index(112);	index(113);	index(114);	index(115);	index(116);	index(117);	index(118);	index(119);
		index(120);	index(121);	index(122);	index(123);	index(124);	index(125);	index(126);	index(127);	index(128);	index(129);
		index(130);	index(131);	index(132);	index(133);	index(134);	index(135);	index(136);	index(137);	index(138);	index(139);
		index(140);	index(141);	index(142);	index(143);	index(144);	index(145);	index(146);	index(147);	index(148);	index(149);
		index(150);	index(151);	index(152);	index(153);	index(154);	index(155);	index(156);	index(157);	index(158);	index(159);
		index(160);	index(161);	index(162);	index(163);	index(164);	index(165);	index(166);	index(167);	index(168);	index(169);
		index(170);
	}

#undef index
}